

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,SizeType *range)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  SizeType SVar5;
  Range *pRVar6;
  SizeType index;
  int iVar7;
  SizeType local_44;
  uint codepoint;
  uint local_3c;
  SizeType *local_38;
  
  bVar2 = 1;
  local_3c = 0;
  iVar7 = 0;
  local_44 = 0xffffffff;
  local_38 = range;
  index = 0xffffffff;
LAB_0011f436:
  while( true ) {
    while( true ) {
      codepoint = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
                  ::Take(ds);
      if (codepoint == 0) {
        return false;
      }
      if (!(bool)(bVar2 & codepoint == 0x5e)) break;
      local_3c = (uint)CONCAT71((uint7)(uint3)(codepoint >> 8),1);
      bVar2 = 0;
    }
    if (codepoint == 0x5c) {
      if (ds->codepoint_ == 0x62) {
        DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
        ::Take(ds);
        codepoint = 8;
      }
      else {
        bVar4 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                          (this,ds,&codepoint);
        if (!bVar4) {
          return false;
        }
      }
    }
    else if (codepoint == 0x5d) {
      if (local_44 == 0xffffffff) {
        return false;
      }
      if (iVar7 == 2) {
        SVar5 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewRange
                          ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,0x2d
                          );
        if (index == 0xffffffff) {
          __assert_fail("current != kRegexInvalidRange",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                        ,0x1f8,
                        "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                       );
        }
        pRVar6 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                           ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                            index);
        pRVar6->next = SVar5;
      }
      if ((local_3c & 1) != 0) {
        pRVar6 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                           ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                            local_44);
        pbVar1 = (byte *)((long)&pRVar6->start + 3);
        *pbVar1 = *pbVar1 | 0x80;
      }
      *local_38 = local_44;
      return true;
    }
    uVar3 = codepoint;
    if (iVar7 == 1) goto LAB_0011f4c1;
    if (iVar7 != 2) break;
    pRVar6 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                       ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,index);
    pRVar6->end = uVar3;
    iVar7 = 0;
    bVar2 = 0;
  }
  goto LAB_0011f4d0;
LAB_0011f4c1:
  bVar2 = 0;
  iVar7 = 2;
  if (codepoint != 0x2d) {
LAB_0011f4d0:
    SVar5 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::NewRange
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       codepoint);
    if (index != 0xffffffff) {
      pRVar6 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                         ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,index
                         );
      pRVar6->next = SVar5;
    }
    if (local_44 == 0xffffffff) {
      local_44 = SVar5;
    }
    bVar2 = 0;
    iVar7 = 1;
    index = SVar5;
  }
  goto LAB_0011f436;
}

Assistant:

bool ParseRange(DecodedStream<InputStream, Encoding>& ds, SizeType* range) {
        bool isBegin = true;
        bool negate = false;
        int step = 0;
        SizeType start = kRegexInvalidRange;
        SizeType current = kRegexInvalidRange;
        unsigned codepoint;
        while ((codepoint = ds.Take()) != 0) {
            if (isBegin) {
                isBegin = false;
                if (codepoint == '^') {
                    negate = true;
                    continue;
                }
            }

            switch (codepoint) {
            case ']':
                if (start == kRegexInvalidRange)
                    return false;   // Error: nothing inside []
                if (step == 2) { // Add trailing '-'
                    SizeType r = NewRange('-');
                    RAPIDJSON_ASSERT(current != kRegexInvalidRange);
                    GetRange(current).next = r;
                }
                if (negate)
                    GetRange(start).start |= kRangeNegationFlag;
                *range = start;
                return true;

            case '\\':
                if (ds.Peek() == 'b') {
                    ds.Take();
                    codepoint = 0x0008; // Escape backspace character
                }
                else if (!CharacterEscape(ds, &codepoint))
                    return false;
                // fall through to default
                RAPIDJSON_DELIBERATE_FALLTHROUGH;

            default:
                switch (step) {
                case 1:
                    if (codepoint == '-') {
                        step++;
                        break;
                    }
                    // fall through to step 0 for other characters
                    RAPIDJSON_DELIBERATE_FALLTHROUGH;

                case 0:
                    {
                        SizeType r = NewRange(codepoint);
                        if (current != kRegexInvalidRange)
                            GetRange(current).next = r;
                        if (start == kRegexInvalidRange)
                            start = r;
                        current = r;
                    }
                    step = 1;
                    break;

                default:
                    RAPIDJSON_ASSERT(step == 2);
                    GetRange(current).end = codepoint;
                    step = 0;
                }
            }
        }
        return false;
    }